

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

int tcdmain(int argc,char **argv,char *save_ext)

{
  osfildef *fp_00;
  errdef fr_;
  char vsnbuf [128];
  tcderrdef errcbcx;
  osfildef *fp;
  int err;
  errcxdef errctx;
  char *in_stack_000088a8;
  tcderrdef *in_stack_000088b0;
  char **in_stack_000088b8;
  int in_stack_000088c4;
  errcxdef *in_stack_000088c8;
  errdef *local_450;
  int local_448;
  char acStack_444 [12];
  erradef aeStack_438 [10];
  int local_3e8;
  char *in_stack_fffffffffffffc28;
  char local_318 [128];
  FILE *local_298 [2];
  int local_284;
  errcxdef local_260;
  uint local_4;
  
  memset(local_298,0,0x28);
  local_260.errcxlog = tcdlogerr;
  local_260.errcxlgc = (void *)0x0;
  local_260.errcxofs = 0;
  local_260.errcxfp = (osfildef *)0x0;
  local_260.errcxappctx = (appctxdef *)0x0;
  fp_00 = oserrop(in_stack_fffffffffffffc28);
  errini(&local_260,fp_00);
  sprintf(local_318,"%s v%s.%s.%s  %s\n",tcgname,vsn_major,vsn_minor,vsn_maint,
          "Copyright (c) 1993, 2012 Michael J. Roberts");
  tcdptf(local_318);
  sprintf(local_318,"TADS for %s [%s] patchlevel %s.%s\n","POSIX/Unix/MS-Windows",
          "POSIX_UNIX_MSWINDOWS","1","0");
  tcdptf(local_318);
  tcdptf("%s maintains this port.\n","Nikos Chantziaras <realnc@gmail.com>");
  local_448 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffc20);
  if (local_448 == 0) {
    local_450 = local_260.errcxptr;
    local_260.errcxptr = (errdef *)&local_450;
    tcdmain1(in_stack_000088c8,in_stack_000088c4,in_stack_000088b8,in_stack_000088b0,
             in_stack_000088a8);
    local_260.errcxptr = local_450;
    if ((FILE *)local_260.errcxfp != (FILE *)0x0) {
      fclose((FILE *)local_260.errcxfp);
    }
    if (local_298[0] != (FILE *)0x0) {
      fclose(local_298[0]);
    }
    maybe_pause();
    local_4 = (uint)(local_284 != 0);
  }
  else {
    local_260.errcxptr = local_450;
    if (local_448 != 0x5dc) {
      (*local_260.errcxlog)(local_260.errcxlgc,acStack_444,local_448,local_3e8,aeStack_438);
    }
    if ((FILE *)local_260.errcxfp != (FILE *)0x0) {
      fclose((FILE *)local_260.errcxfp);
    }
    if (local_298[0] != (FILE *)0x0) {
      fclose(local_298[0]);
    }
    maybe_pause();
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int tcdmain(int argc, char **argv, char *save_ext)
{
    errcxdef   errctx;
    int        err;
    osfildef  *fp;
    extern     char tcgname[];
    tcderrdef  errcbcx;                           /* error callback context */
    char       vsnbuf[128];

    /* initialize the error structure */
    CLRSTRUCT(errcbcx);
    errcbcx.tcdwrn_AMBIGBIN = TRUE;                   /* -v+abin by default */

    errctx.errcxlog = tcdlogerr;
    errctx.errcxlgc = (void *)0;
    errctx.errcxofs = 0;
    errctx.errcxfp  = (osfildef *)0;
    errctx.errcxappctx = 0;
    fp = oserrop(argv[0]);
    errini(&errctx, fp);

    /* copyright-date-string */
    sprintf(vsnbuf, "%s v%s.%s.%s  %s\n", tcgname,
            vsn_major, vsn_minor, vsn_maint,
            "Copyright (c) 1993, 2012 Michael J. Roberts");
    tcdptf(vsnbuf);
    sprintf(vsnbuf, "TADS for %s [%s] patchlevel %s.%s\n",
            OS_SYSTEM_LDESC, OS_SYSTEM_NAME,
            TADS_OEM_VERSION, OS_SYSTEM_PATCHSUBLVL);
    tcdptf(vsnbuf);
    tcdptf("%s maintains this port.\n", TADS_OEM_NAME);
    
    ERRBEGIN(&errctx)
        tcdmain1(&errctx, argc, argv, &errcbcx, save_ext);
    ERRCATCH(&errctx, err)
        if (err != ERR_USAGE)
            errclog(&errctx);
    
        if (errctx.errcxfp) osfcls(errctx.errcxfp);
        if (errcbcx.tcderrfil) fclose(errcbcx.tcderrfil);
        /* os_expause(); */
        maybe_pause();
        return(OSEXFAIL);
    ERREND(&errctx)

    /* close message file */
    if (errctx.errcxfp) osfcls(errctx.errcxfp);

    /* close error echo file if any */
    if (errcbcx.tcderrfil) fclose(errcbcx.tcderrfil);

    /* os_expause(); */
    maybe_pause();
    return(errcbcx.tcderrcnt == 0 ? OSEXSUCC : OSEXFAIL);
}